

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O2

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_short>::var_node_update
          (RateAdaptiveCode<unsigned_short> *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_v,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *msg_c,vector<double,_std::allocator<double>_> *llrs)

{
  ushort uVar1;
  ushort uVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  double *pdVar7;
  long lVar8;
  pointer puVar9;
  pointer pvVar10;
  long lVar11;
  double *pdVar12;
  size_t k;
  long lVar13;
  double dVar14;
  vector<unsigned_short,_std::allocator<unsigned_short>_> mv_position;
  allocator_type local_49;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,this->n_cols,
             &local_49);
  pdVar3 = (llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar5 = (msg_c->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->pos_checkn).
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar11 = 0; lVar11 != (long)pdVar4 - (long)pdVar3 >> 3; lVar11 = lVar11 + 1) {
    dVar14 = pdVar3[lVar11];
    pdVar7 = pvVar5[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pdVar12 = pdVar7;
        pdVar12 !=
        *(pointer *)
         ((long)&pvVar5[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data + 8); pdVar12 = pdVar12 + 1) {
      dVar14 = dVar14 + *pdVar12;
    }
    lVar8 = *(long *)&pvVar6[lVar11].
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data;
    puVar9 = *(pointer *)
              ((long)&pvVar6[lVar11].
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data + 8);
    pvVar10 = (msg_v->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    for (lVar13 = 0; (long)puVar9 - lVar8 >> 1 != lVar13; lVar13 = lVar13 + 1) {
      uVar1 = *(ushort *)(lVar8 + lVar13 * 2);
      uVar2 = local_48._M_impl.super__Vector_impl_data._M_start[uVar1];
      *(double *)
       (*(long *)&pvVar10[uVar1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + (ulong)uVar2 * 8) = dVar14 - pdVar7[lVar13];
      local_48._M_impl.super__Vector_impl_data._M_start[uVar1] = uVar2 + 1;
    }
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void var_node_update(std::vector<std::vector<double>> &msg_v,
                             const std::vector<std::vector<double>> &msg_c,
                             const std::vector<double> &llrs) const {
            std::vector<idx_t> mv_position(n_cols);

            for (std::size_t m{}; m < llrs.size(); ++m) {
                const double mv_sum = std::accumulate(msg_c[m].begin(), msg_c[m].end(), llrs[m]);

                // Note: pos_checkn[m].size() = var_node_degs[m]
                for (std::size_t k{}; k < pos_checkn[m].size(); ++k) {
                    const double msg = mv_sum - msg_c[m][k];

                    // place the message at the correct position in the output array
                    const idx_t curr_pos_cn = pos_checkn[m][k];
                    msg_v[curr_pos_cn][mv_position[curr_pos_cn]] = msg;
                    mv_position[curr_pos_cn]++;
                }
            }
        }